

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::XThreadPaf::FulfillScope::FulfillScope(FulfillScope *this,XThreadPaf **pointer)

{
  XThreadPaf *pXVar1;
  bool bVar2;
  anon_enum_32 oldState;
  Fault f;
  DebugComparison<kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)_&,_kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)>
  _kjCondition;
  
  LOCK();
  pXVar1 = *pointer;
  *pointer = (XThreadPaf *)0x0;
  UNLOCK();
  this->obj = pXVar1;
  if (pXVar1 != (XThreadPaf *)0x0) {
    LOCK();
    oldState = pXVar1->state;
    bVar2 = oldState == WAITING;
    if (bVar2) {
      pXVar1->state = FULFILLING;
      oldState = WAITING;
    }
    UNLOCK();
    if (!bVar2) {
      _kjCondition.left = &oldState;
      _kjCondition.right = CANCELED;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = oldState == CANCELED;
      if (!_kjCondition.result) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadPaf::_unnamed_type_1_&,_unnamed_type_1_>&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x4c7,FAILED,"oldState == CANCELED","_kjCondition,",&_kjCondition);
        Debug::Fault::fatal(&f);
      }
      if (this->obj != (XThreadPaf *)0x0) {
        (*(this->obj->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[6])();
      }
      this->obj = (XThreadPaf *)0x0;
    }
  }
  return;
}

Assistant:

XThreadPaf::FulfillScope::FulfillScope(XThreadPaf** pointer) {
  obj = __atomic_exchange_n(pointer, static_cast<XThreadPaf*>(nullptr), __ATOMIC_ACQUIRE);
  auto oldState = WAITING;
  if (obj == nullptr) {
    // Already fulfilled (possibly by another thread).
  } else if (__atomic_compare_exchange_n(&obj->state, &oldState, FULFILLING, false,
                                         __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
    // Transitioned to FULFILLING, good.
  } else {
    // The waiting thread must have canceled.
    KJ_ASSERT(oldState == CANCELED);

    // It's our responsibility to clean up, then.
    delete obj;

    // Set `obj` null so that we don't try to fill it in or delete it later.
    obj = nullptr;
  }
}